

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_trait.cpp
# Opt level: O1

void __thiscall
pfederc::Parser::parseTraitImpl
          (Parser *this,bool *err,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *impltraits)

{
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var1;
  long lVar2;
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var3;
  bool bVar4;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> rhs;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_30;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_28;
  
  parseExpression((Parser *)&stack0xffffffffffffffd0,(Precedence)this);
  bVar4 = (Lexer *)local_30._M_head_impl == (Lexer *)0x0;
  if (!bVar4) {
    if (*(int *)&(((string *)&(local_30._M_head_impl)->type)->_M_dataplus)._M_p == 0x12) {
      do {
        _Var3._M_head_impl = local_30._M_head_impl;
        if ((local_30._M_head_impl)->_vptr_Expr != (_func_int **)&PTR__BiOpExpr_0012b998) {
          __cxa_bad_cast();
        }
        if (*(short *)&local_30._M_head_impl[1].parent != 0x2e) break;
        if ((local_30._M_head_impl)->_vptr_Expr != (_func_int **)&PTR__BiOpExpr_0012b998) {
          __cxa_bad_cast();
        }
        local_28._M_head_impl = *(Expr **)&local_30._M_head_impl[1].type;
        *(undefined8 *)&local_30._M_head_impl[1].type = 0;
        if (local_28._M_head_impl != (Expr *)0x0) {
          std::
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ::_M_insert_rval(impltraits,
                           (impltraits->
                           super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                           (value_type *)&stack0xffffffffffffffd8);
        }
        _Var1._M_head_impl = *(Expr **)&_Var3._M_head_impl[1].lexer;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&_Var3._M_head_impl[1].lexer)->_M_allocated_capacity = 0;
        if ((tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_30._M_head_impl !=
            (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
          lVar2 = *(long *)local_30._M_head_impl;
          local_30._M_head_impl = _Var1._M_head_impl;
          (**(code **)(lVar2 + 8))();
          _Var1._M_head_impl = local_30._M_head_impl;
        }
        local_30._M_head_impl = _Var1._M_head_impl;
        if ((_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)
            local_28._M_head_impl != (Expr *)0x0) {
          (**(code **)((long)*(__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
                               *)local_28._M_head_impl + 8))();
        }
        bVar4 = (Lexer *)local_30._M_head_impl == (Lexer *)0x0;
        if (bVar4) goto LAB_0011a64e;
      } while (*(int *)&(((string *)&(local_30._M_head_impl)->type)->_M_dataplus)._M_p == 0x12);
    }
    if (!bVar4) {
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::_M_insert_rval(impltraits,
                       (impltraits->
                       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (value_type *)&stack0xffffffffffffffd0);
    }
  }
LAB_0011a64e:
  if ((_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_30._M_head_impl
      != (Expr *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Expr[1])();
  }
  return;
}

Assistant:

void Parser::parseTraitImpl(bool &err,
    std::vector<std::unique_ptr<Expr>> &impltraits) noexcept {
  // inherit traits
  std::unique_ptr<Expr> expr(parseExpression());
  // comma separated list of expressions
  while (expr && isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    auto rhs = biopexpr.getRightPtr();
    if (rhs)
      impltraits.insert(impltraits.begin(), std::move(rhs));
    // next iterator step
    expr = biopexpr.getLeftPtr();
  }

  if (expr)
    impltraits.insert(impltraits.begin(), std::move(expr));
}